

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool MTCB(void *a_context,ON__INT_PTR a_id)

{
  ON_3dPoint *p;
  ON_3dPoint *__return_storage_ptr__;
  int vertex_index;
  double dVar1;
  double d1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  double t1;
  double t0;
  double pivot_ratio;
  ON_3dex fcis [2];
  double t;
  ON_3dPoint ptPV;
  ON_3dPoint ptV;
  ON_Line edge;
  ON_3dPoint ptE;
  double local_188;
  long local_180;
  ON_MeshFace *local_178;
  double local_170;
  undefined8 *local_168;
  ON__INT_PTR local_160;
  undefined8 *local_158;
  double local_150;
  ON_3dex local_148;
  double local_13c;
  int local_134;
  ON_3dVector local_130;
  ON_3dPoint local_118;
  long local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  ON_3dPoint local_e0;
  ON_Line local_c8;
  ON_3dPoint local_98;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  bVar2 = true;
  if (a_context != (void *)0x0) {
    *(undefined1 *)((long)a_context + 0x70) = 0;
    uVar6 = (uint)a_id;
    if ((-1 < (int)uVar6) && ((int)uVar6 < *(int *)(*a_context + 0x50))) {
      local_178 = (ON_MeshFace *)((ulong)(uVar6 & 0x7fffffff) * 0x10 + *(long *)(*a_context + 0x48))
      ;
      local_160 = a_id;
      bVar2 = ON_MeshFace::IsTriangle(local_178);
      uVar6 = 4 - bVar2;
      p = (ON_3dPoint *)((long)a_context + 8);
      local_168 = (undefined8 *)((long)a_context + 0x48);
      local_180 = (ulong)uVar6 - 1;
      uVar5 = 0;
      do {
        ON_Mesh::Vertex(&local_e0,*a_context,local_178->vi[uVar5]);
        dVar1 = ON_3dPoint::DistanceTo(&local_e0,p);
        if (dVar1 < *(double *)((long)a_context + 0x68)) {
          *(double *)((long)a_context + 0x68) = dVar1;
          *(int *)((long)a_context + 0x40) = (int)local_160;
          local_168[2] = 0;
          local_168[3] = 0;
          *local_168 = 0;
          local_168[1] = 0;
          *(undefined8 *)((long)a_context + uVar5 * 8 + 0x48) = 0x3ff0000000000000;
        }
        lVar4 = (long)(((int)local_180 + (int)uVar5) % (int)uVar6);
        ON_Mesh::Vertex(&local_118,*a_context,local_178->vi[lVar4]);
        from_pt.y = local_118.y;
        from_pt.x = local_118.x;
        from_pt.z = local_118.z;
        to_pt.y = local_e0.y;
        to_pt.x = local_e0.x;
        to_pt.z = local_e0.z;
        ON_Line::ON_Line(&local_c8,from_pt,to_pt);
        local_130.x = 0.0;
        bVar2 = ON_Line::ClosestPointTo(&local_c8,p,&local_130.x);
        if (((bVar2) && (0.0 <= local_130.x)) && (local_130.x <= 1.0)) {
          ON_Line::PointAt(&local_78,&local_c8,local_130.x);
          dVar1 = ON_3dPoint::DistanceTo(&local_78,p);
          if (dVar1 < *(double *)((long)a_context + 0x68)) {
            *(double *)((long)a_context + 0x68) = dVar1;
            *(int *)((long)a_context + 0x40) = (int)local_160;
            local_168[2] = 0;
            local_168[3] = 0;
            *local_168 = 0;
            local_168[1] = 0;
            *(double *)((long)a_context + uVar5 * 8 + 0x48) = local_130.x;
            *(double *)((long)a_context + lVar4 * 8 + 0x48) = 1.0 - local_130.x;
          }
        }
        ON_Line::~ON_Line(&local_c8);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
      ON_3dex::ON_3dex(&local_148,0,1,2);
      local_134 = ON_3dex::Unset.k;
      local_13c = (double)ON_3dex::Unset._0_8_;
      bVar2 = ON_MeshFace::IsQuad(local_178);
      iVar3 = 1;
      if (bVar2) {
        ON_3dex::ON_3dex((ON_3dex *)&local_c8,0,3,2);
        local_134 = local_c8.from.y._0_4_;
        local_13c = local_c8.from.x;
        iVar3 = 2;
      }
      local_100 = (ulong)(uint)(iVar3 << 2) * 3;
      local_180 = 0;
      local_158 = (undefined8 *)a_context;
      do {
        iVar3 = local_178->vi[*(int *)((long)&local_148.j + local_180)];
        vertex_index = local_178->vi[*(int *)((long)&local_148.k + local_180)];
        ON_Mesh::Vertex(&local_c8.from,*a_context,
                        local_178->vi[*(int *)((long)&local_148.i + local_180)]);
        __return_storage_ptr__ = &local_c8.to;
        ON_Mesh::Vertex(__return_storage_ptr__,*a_context,iVar3);
        ON_Mesh::Vertex(&local_98,*a_context,vertex_index);
        local_170 = 0.0;
        local_188 = 0.0;
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,__return_storage_ptr__,&local_c8.from);
        dVar1 = ON_3dVector::LengthSquared((ON_3dVector *)&local_e0);
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,__return_storage_ptr__,&local_c8.from);
        ON_3dPoint::operator-((ON_3dVector *)&local_118,&local_98,&local_c8.from);
        local_e8 = ON_DotProduct((ON_3dVector *)&local_e0,(ON_3dVector *)&local_118);
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,p,&local_c8.from);
        ON_3dPoint::operator-((ON_3dVector *)&local_118,__return_storage_ptr__,&local_c8.from);
        local_f0 = ON_DotProduct((ON_3dVector *)&local_e0,(ON_3dVector *)&local_118);
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,&local_98,&local_c8.from);
        local_f8 = ON_3dVector::LengthSquared((ON_3dVector *)&local_e0);
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,p,&local_c8.from);
        ON_3dPoint::operator-((ON_3dVector *)&local_118,&local_98,&local_c8.from);
        d1 = ON_DotProduct((ON_3dVector *)&local_e0,(ON_3dVector *)&local_118);
        local_150 = 0.0;
        iVar3 = ON_Solve2x2(dVar1,local_e8,local_e8,local_f8,local_f0,d1,&local_170,&local_188,
                            &local_150);
        dVar1 = local_170;
        a_context = local_158;
        if (iVar3 == 2) {
          if (local_150 < 0.01) {
            ON_3dPoint::operator-(&local_130,&local_c8.to,&local_c8.from);
            operator*((ON_3dVector *)&local_78,dVar1,&local_130);
            ON_3dPoint::operator+(&local_118,&local_c8.from,(ON_3dVector *)&local_78);
            dVar1 = local_188;
            ON_3dPoint::operator-(&local_60,&local_98,&local_c8.from);
            operator*(&local_48,dVar1,&local_60);
            ON_3dPoint::operator+(&local_e0,&local_118,&local_48);
            ON_3dPoint::operator-((ON_3dVector *)&local_118,p,&local_e0);
            dVar1 = ON_3dVector::LengthAndUnitize((ON_3dVector *)&local_118);
            if (1e-12 <= dVar1) {
              ON_3dPoint::operator-(&local_130,&local_98,&local_c8.from);
              ON_3dPoint::operator-(&local_48,&local_98,&local_c8.to);
              ON_CrossProduct((ON_3dVector *)&local_78,&local_130,&local_48);
              bVar2 = ON_3dVector::Unitize((ON_3dVector *)&local_78);
              a_context = local_158;
              if ((!bVar2) ||
                 (dVar1 = ON_DotProduct((ON_3dVector *)&local_78,(ON_3dVector *)&local_118),
                 a_context = local_158, ABS(dVar1) < 0.99)) goto LAB_004db517;
            }
          }
          a_context = local_158;
          dVar1 = local_170;
          if ((0.0 <= local_170) && ((0.0 <= local_188 && (local_188 + local_170 <= 1.0)))) {
            ON_3dPoint::operator-(&local_130,&local_c8.to,&local_c8.from);
            operator*((ON_3dVector *)&local_78,dVar1,&local_130);
            ON_3dPoint::operator+(&local_118,&local_c8.from,(ON_3dVector *)&local_78);
            dVar1 = local_188;
            ON_3dPoint::operator-(&local_60,&local_98,&local_c8.from);
            operator*(&local_48,dVar1,&local_60);
            ON_3dPoint::operator+(&local_e0,&local_118,&local_48);
            dVar1 = ON_3dPoint::DistanceTo(&local_e0,p);
            if (dVar1 < *(double *)((long)a_context + 0x68)) {
              *(double *)((long)a_context + 0x68) = dVar1;
              *(int *)((long)a_context + 0x40) = (int)local_160;
              local_168[2] = 0;
              local_168[3] = 0;
              *local_168 = 0;
              local_168[1] = 0;
              *(double *)
               ((long)a_context + ((long)*(int *)((long)&local_148.i + local_180) + 9) * 8) =
                   (1.0 - local_170) - local_188;
              *(double *)
               ((long)a_context + ((long)*(int *)((long)&local_148.j + local_180) + 9) * 8) =
                   local_170;
              *(double *)
               ((long)a_context + ((long)*(int *)((long)&local_148.k + local_180) + 9) * 8) =
                   local_188;
            }
          }
        }
LAB_004db517:
        local_180 = local_180 + 0xc;
      } while (local_100 != local_180);
      dVar1 = *(double *)((long)a_context + 0x68);
      bVar2 = *(double *)((long)a_context + 0x38) <= dVar1;
      if (dVar1 < *(double *)((long)a_context + 0x38)) {
        *(double *)((long)a_context + 0x38) = dVar1;
        *(undefined1 *)((long)a_context + 0x70) = 1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_CALLBACK_CDECL MTCB(void* a_context, ON__INT_PTR a_id)
{
  ON__MTCBDATA* pData = (ON__MTCBDATA*)a_context;
  if (nullptr == pData)
    return true;
  pData->m_bRestart = false;
  const int fi = (int)a_id;
  if (fi < 0 || fi >= pData->m_pMesh->m_F.Count())
    return true;
  const ON_MeshFace& face = pData->m_pMesh->m_F[fi];
  const int fcc = face.IsTriangle() ? 3 : 4;
  for (int fci = 0; fci < fcc; fci++)
  {
    // Distance to vertex at corner fci
    const ON_3dPoint ptV = pData->m_pMesh->Vertex(face.vi[fci]);
    const double distV = ptV.DistanceTo(pData->m_pt);
    if (distV < pData->m_dist)
    {
      pData->m_dist = distV;
      pData->m_face_index = fi;
      pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
      pData->m_t[fci] = 1.0;
    }

    // Distance to edge between corners fci-1 and fci
    const int fcip = (fci + fcc - 1) % fcc;
    const ON_3dPoint ptPV = pData->m_pMesh->Vertex(face.vi[fcip]);
    ON_Line edge(ptPV, ptV);
    double t = 0.0;
    if (edge.ClosestPointTo(pData->m_pt, &t))
    {
      if (t >= 0.0 && t <= 1.0)
      {
        const ON_3dPoint ptE = edge.PointAt(t);
        const double distE = ptE.DistanceTo(pData->m_pt);
        if (distE < pData->m_dist)
        {
          pData->m_dist = distE;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fci] = t;
          pData->m_t[fcip] = 1.0 - t;
        }
      }
    }
  }

  int tris = 1;
  ON_3dex fcis[2] = { {0, 1, 2}, ON_3dex::Unset };
  //int fcis[2][3] = {{0, 1, 2}, {ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX}};
  if (face.IsQuad())
  {
    fcis[1] = { 0, 3, 2 };
    tris = 2;
  }

  for (int ti = 0; ti < tris; ti++)
  {
    const int vis[3] = { face.vi[fcis[ti].i] , face.vi[fcis[ti].j], face.vi[fcis[ti].k] };
    const ON_3dPoint pts[3] = { pData->m_pMesh->Vertex(vis[0]), pData->m_pMesh->Vertex(vis[1]), pData->m_pMesh->Vertex(vis[2]) };
    double t0 = 0.0, t1 = 0.0;
    if (ProjectToFaceSpace(pts[0], pts[1], pts[2], pData->m_pt, t0, t1))
    {
      if (0 <= t0 && 0 <= t1 && t0 + t1 <= 1.0)
      {
        const ON_3dPoint ptF = pts[0] + t0 * (pts[1] - pts[0]) + t1 * (pts[2] - pts[0]);
        const double distF = ptF.DistanceTo(pData->m_pt);
        if (distF < pData->m_dist)
        {
          pData->m_dist = distF;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fcis[ti].i] = 1.0 - t0 - t1;
          pData->m_t[fcis[ti].j] = t0;
          pData->m_t[fcis[ti].k] = t1;
        }
      }
    }
  }

  if (pData->m_dist < pData->m_sphere.m_radius)
  {
    pData->m_sphere.m_radius = pData->m_dist;
    pData->m_bRestart = true;
    return false;
  }

  return true;
}